

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

void BrotliEncoderInitParams(BrotliEncoderParams *params)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[9] = 0;
  in_RDI[1] = 0xb;
  in_RDI[2] = 0x16;
  in_RDI[3] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0;
  duckdb_brotli::BrotliInitSharedEncoderDictionary((SharedEncoderDictionary *)0x234a37b);
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0x40;
  in_RDI[0x11] = in_RDI[0x10];
  *(undefined8 *)(in_RDI + 0x12) = 0x3fffffc;
  return;
}

Assistant:

static void BrotliEncoderInitParams(BrotliEncoderParams* params) {
  params->mode = BROTLI_DEFAULT_MODE;
  params->large_window = BROTLI_FALSE;
  params->quality = BROTLI_DEFAULT_QUALITY;
  params->lgwin = BROTLI_DEFAULT_WINDOW;
  params->lgblock = 0;
  params->stream_offset = 0;
  params->size_hint = 0;
  params->disable_literal_context_modeling = BROTLI_FALSE;
  BrotliInitSharedEncoderDictionary(&params->dictionary);
  params->dist.distance_postfix_bits = 0;
  params->dist.num_direct_distance_codes = 0;
  params->dist.alphabet_size_max =
      BROTLI_DISTANCE_ALPHABET_SIZE(0, 0, BROTLI_MAX_DISTANCE_BITS);
  params->dist.alphabet_size_limit = params->dist.alphabet_size_max;
  params->dist.max_distance = BROTLI_MAX_DISTANCE;
}